

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_base_access<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
               (void)

{
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  value_type col1;
  value_type col2;
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_> m;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ();
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&col2,columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
  columns.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       columns.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&(columns.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&col1,columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
  columns.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       columns.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&(columns.
                    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>> *)&m
             ,&columns,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&columns,&m);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>::
  insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>> *)&m
             ,&col1);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back(&columns,&col1);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>::
  insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>> *)&m
             ,&col2);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::push_back(&columns,&col2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&columns,&m);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::~Matrix(&m)
  ;
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&col1.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&col2.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 );
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_base_access() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  auto col2 = columns.back();
  columns.pop_back();
  auto col1 = columns.back();
  columns.pop_back();

  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.insert_column(col1);
  columns.push_back(col1);
  m.insert_column(col2);
  columns.push_back(col2);

  test_content_equality(columns, m);
}